

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O2

CURLcode curl_easy_send(CURL *curl,void *buffer,size_t buflen,size_t *n)

{
  CURLcode CVar1;
  curl_socket_t sfd;
  connectdata *c;
  ssize_t n1;
  
  c = (connectdata *)0x0;
  CVar1 = easy_connection((SessionHandle *)curl,&sfd,&c);
  if (CVar1 == CURLE_OK) {
    *n = 0;
    CVar1 = Curl_write(c,sfd,buffer,buflen,&n1);
    if (n1 == -1) {
      CVar1 = CURLE_SEND_ERROR;
    }
    else if (CVar1 == CURLE_OK && n1 == 0) {
      CVar1 = CURLE_AGAIN;
    }
    else {
      *n = n1;
    }
  }
  return CVar1;
}

Assistant:

CURLcode curl_easy_send(CURL *curl, const void *buffer, size_t buflen,
                        size_t *n)
{
  curl_socket_t sfd;
  CURLcode ret;
  ssize_t n1;
  struct connectdata *c = NULL;
  struct SessionHandle *data = (struct SessionHandle *)curl;

  ret = easy_connection(data, &sfd, &c);
  if(ret)
    return ret;

  *n = 0;
  ret = Curl_write(c, sfd, buffer, buflen, &n1);

  if(n1 == -1)
    return CURLE_SEND_ERROR;

  /* detect EAGAIN */
  if((CURLE_OK == ret) && (0 == n1))
    return CURLE_AGAIN;

  *n = (size_t)n1;

  return ret;
}